

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O3

void Lf_ManSetMapRefsOne(Lf_Man_t *p,int iObj)

{
  long *plVar1;
  int iVar2;
  int iVar3;
  Lf_Bst_t *pLVar4;
  Gia_Man_t *pGVar5;
  Gia_Obj_t *pGVar6;
  int *piVar7;
  undefined8 uVar8;
  Jf_Par_t *pJVar9;
  Lf_Cut_t *pLVar10;
  long lVar11;
  Lf_Plc_t LVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  float fVar18;
  double dVar19;
  
  if (((iObj < 0) || ((p->vOffsets).nSize <= iObj)) || ((p->vRequired).nSize <= iObj)) {
LAB_006db7e0:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar2 = (p->vOffsets).pArray[(uint)iObj];
  if ((iVar2 < 0) || ((p->vMapRefs).nSize <= iVar2)) goto LAB_006db7e0;
  if ((p->vMapRefs).pArray[iVar2] < 1) {
    __assert_fail("Lf_ObjMapRefNum(p, iObj) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaLf.c"
                  ,0x5aa,"void Lf_ManSetMapRefsOne(Lf_Man_t *, int)");
  }
  pLVar4 = p->pObjBests;
  LVar12 = pLVar4[iVar2].Cut[0];
  if ((((uint)LVar12 & 1) != 0) || (((uint)pLVar4[iVar2].Cut[1] & 1) != 0)) {
    __assert_fail("!pBest->Cut[0].fUsed && !pBest->Cut[1].fUsed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaLf.c"
                  ,0x5ab,"void Lf_ManSetMapRefsOne(Lf_Man_t *, int)");
  }
  iVar3 = (p->vRequired).pArray[(uint)iObj];
  if (p->pPars->fUseMux7 != 0) {
    pGVar5 = p->pGia;
    if ((((pGVar5->pMuxes != (uint *)0x0) && (pGVar5->pMuxes[(uint)iObj] != 0)) &&
        (pLVar4[iVar2].Delay[2] <= iVar3)) && (pLVar4[iVar2].Flow[2] <= pLVar4[iVar2].Flow[1] * 1.1)
       ) {
      if (pGVar5->nObjs <= iObj) {
LAB_006db7ff:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar6 = pGVar5->pObjs;
      uVar16 = (uint)*(undefined8 *)(pGVar6 + (uint)iObj);
      if ((uVar16 >> 0x1e & 1) == 0) {
        uVar14 = (ulong)(uVar16 & 0x1fffffff);
        if ((((uint)*(ulong *)(pGVar6 + ((uint)iObj - uVar14)) >> 0x1e & 1) == 0) &&
           ((pGVar6[(ulong)(uint)iObj -
                    (ulong)((uint)((ulong)*(undefined8 *)(pGVar6 + (uint)iObj) >> 0x20) & 0x1fffffff
                           )].field_0x3 & 0x40) == 0)) {
          *(ulong *)(pGVar6 + ((uint)iObj - uVar14)) =
               *(ulong *)(pGVar6 + ((uint)iObj - uVar14)) | 0x40000000;
          *(ulong *)(pGVar6 + ((ulong)(uint)iObj -
                              (ulong)(*(uint *)&pGVar6[(uint)iObj].field_0x4 & 0x1fffffff))) =
               *(ulong *)(pGVar6 + ((ulong)(uint)iObj -
                                   (ulong)(*(uint *)&pGVar6[(uint)iObj].field_0x4 & 0x1fffffff))) |
               0x40000000;
          goto LAB_006db63f;
        }
      }
    }
  }
  if (((uint)pLVar4[iVar2].Cut[1] ^ (uint)LVar12) < 2) {
    uVar14 = 0;
  }
  else {
    uVar14 = (ulong)(pLVar4[iVar2].Delay[1] <= iVar3);
    LVar12 = pLVar4[iVar2].Cut[uVar14];
  }
  pLVar4[iVar2].Cut[uVar14] = (Lf_Plc_t)((uint)LVar12 | 1);
LAB_006db63f:
  pLVar10 = Lf_ObjCutBest(p,iObj);
  uVar16 = *(uint *)&pLVar10->field_0x14;
  if (((byte)(uVar16 >> 0x17) & (uVar16 & 0xff000000) != 0x3000000) != 0) {
    __assert_fail("!pCut->fMux7 || pCut->nLeaves == 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaLf.c"
                  ,0x5b2,"void Lf_ManSetMapRefsOne(Lf_Man_t *, int)");
  }
  if (uVar16 < 0x1000000) {
    uVar15 = (ulong)(uVar16 >> 0x18);
  }
  else {
    uVar14 = 0;
    do {
      uVar16 = *(uint *)((long)&pLVar10[1].Sign + uVar14 * 4);
      lVar11 = (long)(int)uVar16;
      if ((lVar11 < 0) || ((p->vRequired).nSize <= (int)uVar16)) goto LAB_006db7e0;
      piVar7 = (p->vRequired).pArray;
      if (iVar3 <= piVar7[lVar11]) {
        piVar7[lVar11] = iVar3 + -1;
        uVar16 = *(uint *)((long)&pLVar10[1].Sign + uVar14 * 4);
        if ((int)uVar16 < 0) goto LAB_006db7ff;
      }
      if (p->pGia->nObjs <= (int)uVar16) goto LAB_006db7ff;
      uVar8 = *(undefined8 *)(p->pGia->pObjs + uVar16);
      uVar17 = (uint)uVar8;
      if (((~uVar17 & 0x1fffffff) != 0 && -1 < (int)uVar17) &&
         ((((uint)((ulong)uVar8 >> 0x20) ^ uVar17) & 0x1fffffff) != 0)) {
        if ((p->vOffsets).nSize <= (int)uVar16) goto LAB_006db7e0;
        iVar2 = (p->vOffsets).pArray[uVar16];
        if (((long)iVar2 < 0) || ((p->vMapRefs).nSize <= iVar2)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        piVar7 = (p->vMapRefs).pArray + iVar2;
        *piVar7 = *piVar7 + 1;
      }
      uVar14 = uVar14 + 1;
      uVar16 = *(uint *)&pLVar10->field_0x14;
      uVar15 = (ulong)(uVar16 >> 0x18);
    } while (uVar14 < uVar15);
  }
  if ((uVar16 >> 0x17 & 1) == 0) {
    iVar2 = (p->vSwitches).nSize;
    if (iVar2 != 0) {
      dVar19 = 0.0;
      if (0xffffff < uVar16) {
        fVar18 = 0.0;
        uVar14 = 0;
        do {
          iVar3 = *(int *)((long)&pLVar10[1].Sign + uVar14 * 4);
          if (((long)iVar3 < 0) || (iVar2 <= iVar3)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecFlt.h"
                          ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
          }
          fVar18 = fVar18 + (p->vSwitches).pArray[iVar3];
          uVar14 = uVar14 + 1;
        } while (uVar15 != uVar14);
        dVar19 = (double)fVar18;
      }
      p->Switches = dVar19 + p->Switches;
      uVar16 = *(uint *)&pLVar10->field_0x14;
    }
    uVar14 = (ulong)(uVar16 >> 0x18);
    lVar11 = 0xa0;
    lVar13 = 0xa8;
  }
  else {
    lVar11 = 0xa8;
    uVar14 = 1;
    lVar13 = 0xb8;
  }
  pJVar9 = p->pPars;
  plVar1 = (long *)((long)&pJVar9->nLutSize + lVar13);
  *plVar1 = *plVar1 + uVar14;
  plVar1 = (long *)((long)&pJVar9->nLutSize + lVar11);
  *plVar1 = *plVar1 + 1;
  return;
}

Assistant:

void Lf_ManSetMapRefsOne( Lf_Man_t * p, int iObj )
{
    Lf_Cut_t * pCut;
    Lf_Bst_t * pBest = Lf_ObjReadBest( p, iObj );
    int k, Index, Required = Lf_ObjRequired( p, iObj );
    assert( Lf_ObjMapRefNum(p, iObj) > 0 );
    assert( !pBest->Cut[0].fUsed && !pBest->Cut[1].fUsed );
    if ( !p->pPars->fUseMux7 || !Lf_ManSetMuxCut(p, pBest, iObj, Required) )
    {
        Index = (int)(Lf_BestDiffCuts(pBest) && pBest->Delay[1] <= Required);
        pBest->Cut[Index].fUsed = 1;
    }
    pCut = Lf_ObjCutBest( p, iObj );
    assert( !pCut->fMux7 || pCut->nLeaves == 3 );
//    assert( pCut->Delay <= Required );
    for ( k = 0; k < (int)pCut->nLeaves; k++ )
    {
//        if ( pCut->fMux7 && pCut->pLeaves[k] != Gia_ObjFaninId2(p->pGia, iObj) )
//            Lf_ObjSetRequired( p, pCut->pLeaves[k], Required );
//        else
            Lf_ObjSetRequired( p, pCut->pLeaves[k], Required - 1 );
        if ( Gia_ObjIsAndNotBuf(Gia_ManObj(p->pGia, pCut->pLeaves[k])) )
            Lf_ObjMapRefInc( p, pCut->pLeaves[k] );
    }
    if ( pCut->fMux7 )
    {
        p->pPars->Mux7++;
        p->pPars->Edge++;
        return;
    }
    if ( Vec_FltSize(&p->vSwitches) )
        p->Switches += Lf_CutSwitches(p, pCut);
    p->pPars->Edge += pCut->nLeaves;
    p->pPars->Area++;
}